

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

vector<const_AST_*,_std::allocator<const_AST_*>_> * __thiscall
AST::findAll(AST *this,RefAST *target)

{
  AST *pAVar1;
  RefCount *in_RDX;
  RefCount<AST> *in_RSI;
  vector<const_AST_*,_std::allocator<const_AST_*>_> *in_RDI;
  bool in_stack_0000001f;
  RefAST *in_stack_00000020;
  vector<const_AST_*,_std::allocator<const_AST_*>_> *in_stack_00000028;
  AST *in_stack_00000030;
  vector<const_AST_*,_std::allocator<const_AST_*>_> *roots;
  vector<const_AST_*,_std::allocator<const_AST_*>_> *other;
  
  other = in_RDI;
  std::vector<const_AST_*,_std::allocator<const_AST_*>_>::vector
            ((vector<const_AST_*,_std::allocator<const_AST_*>_> *)0x28ca79);
  pAVar1 = RefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar1 != (AST *)0x0) {
    RefCount<AST>::RefCount(in_RSI,(RefCount<AST> *)other);
    doWorkForFindAll(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001f);
    RefCount<AST>::~RefCount((RefCount<AST> *)in_RDI);
  }
  return other;
}

Assistant:

std::vector<const AST*> AST::findAll(RefAST target) const
{
	std::vector<const AST*> roots;

	// the empty tree cannot result in an enumeration
	if (target) {
		doWorkForFindAll(roots,target,false); // find all matches recursively
	}

	return roots;
}